

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImBoolVector::Resize(ImBoolVector *this,int sz)

{
  int sz_local;
  ImBoolVector *this_local;
  
  ImVector<int>::resize((ImVector<int> *)this,sz + 0x1f >> 5);
  memset(*(void **)(this + 8),0,(long)*(int *)this << 2);
  return;
}

Assistant:

void            Resize(int sz)          { Storage.resize((sz + 31) >> 5); memset(Storage.Data, 0, (size_t)Storage.Size * sizeof(Storage.Data[0])); }